

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkPermutePiUsingFanout(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void **__base;
  void *Entry;
  int local_1c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  __base = Vec_PtrArray(pNtk->vPis);
  iVar1 = Vec_PtrSize(pNtk->vPis);
  qsort(__base,(long)iVar1,8,Abc_NodeCompareByFanoutCount);
  Vec_PtrClear(pNtk->vCis);
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vPis), local_1c < iVar1; local_1c = local_1c + 1) {
    Entry = Vec_PtrEntry(pNtk->vPis,local_1c);
    Vec_PtrPush(pNtk->vCis,Entry);
  }
  return;
}

Assistant:

void Abc_NtkPermutePiUsingFanout( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode; int i;
    qsort( (void *)Vec_PtrArray(pNtk->vPis), Vec_PtrSize(pNtk->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareByFanoutCount );
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vPis, pNode, i )
        Vec_PtrPush( pNtk->vCis, pNode );
}